

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directives.cpp
# Opt level: O3

bool DirectiveRelativeInclude(ArgumentList *List,int flags)

{
  pointer pEVar1;
  int iVar2;
  
  pEVar1 = (List->entries).
           super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((long)(List->entries).
             super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)pEVar1 == 0x28) &&
     (iVar2 = std::__cxx11::wstring::compare((wchar_t *)pEVar1), iVar2 != 0)) {
    iVar2 = std::__cxx11::wstring::compare
                      ((wchar_t *)
                       (List->entries).
                       super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (iVar2 != 0) {
      Logger::printError<>(Error,L"Invalid arguments");
      return false;
    }
    Global.relativeInclude = false;
  }
  else {
    Global.relativeInclude = true;
  }
  return true;
}

Assistant:

bool DirectiveRelativeInclude(ArgumentList& List, int flags)
{
	if (List.size() == 1)
	{
		if (List[0].text == L"on")
		{
			Global.relativeInclude = true;
		} else if (List[0].text == L"off")
		{
			Global.relativeInclude = false;
		} else {
			Logger::printError(Logger::Error,L"Invalid arguments");
			return false;
		}
	} else {
		Global.relativeInclude = true;
	}
	return true;
}